

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O3

void duckdb::SetSelectionVectorWhere::GetResultLength
               (DataChunk *args,idx_t *result_length,list_entry_t *selection_data,
               Vector *selection_entry,idx_t selection_idx)

{
  bool bVar1;
  InvalidInputException *this;
  ulong uVar2;
  list_entry_t *plVar3;
  Value local_70;
  
  if (selection_data[selection_idx].length != 0) {
    plVar3 = selection_data + selection_idx;
    uVar2 = 0;
    do {
      Vector::GetValue(&local_70,selection_entry,plVar3->offset + uVar2);
      bVar1 = local_70.is_null;
      Value::~Value(&local_70);
      if (bVar1 == true) {
        this = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_70.type_._0_8_ = (long)&local_70 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,
                   "NULLs are not allowed as list elements in the second input parameter.","");
        InvalidInputException::InvalidInputException(this,(string *)&local_70);
        __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Vector::GetValue(&local_70,selection_entry,plVar3->offset + uVar2);
      bVar1 = Value::GetValue<bool>(&local_70);
      Value::~Value(&local_70);
      if (bVar1) {
        *result_length = *result_length + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < plVar3->length);
  }
  return;
}

Assistant:

static void GetResultLength(DataChunk &args, idx_t &result_length, const list_entry_t *selection_data,
	                            Vector selection_entry, idx_t selection_idx) {
		for (idx_t child_idx = 0; child_idx < selection_data[selection_idx].length; child_idx++) {
			if (selection_entry.GetValue(selection_data[selection_idx].offset + child_idx).IsNull()) {
				throw InvalidInputException("NULLs are not allowed as list elements in the second input parameter.");
			}
			if (selection_entry.GetValue(selection_data[selection_idx].offset + child_idx).GetValue<bool>()) {
				result_length++;
			}
		}
	}